

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnInp.cpp
# Opt level: O2

void __thiscall NaPetriCnInput::describe(NaPetriCnInput *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  NaPetriNode *pNVar6;
  NaPetriCnOutput *pNVar7;
  undefined4 extraout_var;
  
  pcVar5 = NaPetriConnector::name(&this->super_NaPetriConnector);
  NaPrintLog("input connector \'%s\': ",pcVar5);
  pNVar6 = NaPetriConnector::host(&this->super_NaPetriConnector);
  if (pNVar6 == (NaPetriNode *)0x0) {
    pcVar5 = "no host node\n";
  }
  else {
    iVar3 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])(this);
    if (iVar3 != 0) {
      uVar1 = this->idData;
      pNVar7 = adjoint(this);
      uVar2 = pNVar7->idData;
      iVar3 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[8])(this);
      uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                        ((long *)CONCAT44(extraout_var,iVar3));
      NaPrintLog("data_id=%d(%d)  data_dim=%u\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar4);
      return;
    }
    pcVar5 = "no links\n";
  }
  NaPrintLog(pcVar5);
  return;
}

Assistant:

void
NaPetriCnInput::describe ()
{
    NaPrintLog("input connector '%s': ", name());
    if(NULL == host()){
        NaPrintLog("no host node\n");
    }else if(0 == links()){
        NaPrintLog("no links\n");
    }else{
        NaPrintLog("data_id=%d(%d)  data_dim=%u\n",
                   idData, adjoint()->idData, data().dim());
    }
}